

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_duck_schema.cpp
# Opt level: O2

unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
* duckdb::ArrowTypeExtensionData::GetExtensionTypes
            (unordered_map<unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,_true>_>_>_>
             *__return_storage_ptr__,ClientContext *context,
            vector<duckdb::LogicalType,_true> *duckdb_types)

{
  bool bVar1;
  DBConfig *this;
  const_reference pvVar2;
  __hashtable *__h;
  pointer __n;
  shared_ptr<duckdb::ArrowTypeExtensionData,_true> sVar3;
  undefined1 local_f8 [32];
  undefined1 auStack_d8 [168];
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  this = DBConfig::GetConfig(context);
  for (__n = (pointer)0x0;
      __n < (pointer)(((long)(duckdb_types->
                             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             ).
                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(duckdb_types->
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                            .
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); __n = __n + 1) {
    pvVar2 = vector<duckdb::LogicalType,_true>::get<true>(duckdb_types,(size_type)__n);
    bVar1 = DBConfig::HasArrowExtension(this,pvVar2);
    if (bVar1) {
      pvVar2 = vector<duckdb::LogicalType,_true>::get<true>(duckdb_types,(size_type)__n);
      DBConfig::GetArrowExtension((ArrowTypeExtension *)(auStack_d8 + 8),this,pvVar2);
      sVar3 = ArrowTypeExtension::GetTypeExtension((ArrowTypeExtension *)local_f8);
      local_f8._24_8_ = local_f8._0_8_;
      auStack_d8._0_8_ = local_f8._8_8_;
      local_f8._0_8_ = (populate_arrow_schema_t)0x0;
      local_f8._8_8_ = (get_type_t)0x0;
      local_f8._16_8_ = __n;
      ::std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>>
                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ArrowTypeExtensionData,true>const>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)__return_storage_ptr__,local_f8 + 0x10,
                 sVar3.internal.
                 super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_d8);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8));
      ArrowTypeExtension::~ArrowTypeExtension((ArrowTypeExtension *)(auStack_d8 + 8));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

unordered_map<idx_t, const shared_ptr<ArrowTypeExtensionData>>
ArrowTypeExtensionData::GetExtensionTypes(ClientContext &context, const vector<LogicalType> &duckdb_types) {
	unordered_map<idx_t, const shared_ptr<ArrowTypeExtensionData>> extension_types;
	const auto &db_config = DBConfig::GetConfig(context);
	for (idx_t i = 0; i < duckdb_types.size(); i++) {
		if (db_config.HasArrowExtension(duckdb_types[i])) {
			extension_types.insert({i, db_config.GetArrowExtension(duckdb_types[i]).GetTypeExtension()});
		}
	}
	return extension_types;
}